

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

int do_recip_sqrt_estimate(int a)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (0x17f < a - 0x80U) {
    __assert_fail("128 <= a && a < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                  ,0x35f,"int do_recip_sqrt_estimate(int)");
  }
  uVar3 = 2 - ((uint)a < 0x100) | a * 2;
  iVar4 = uVar3 * 0x201;
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    uVar5 = (uVar2 + 0x201) * iVar4;
    iVar4 = iVar4 + uVar3;
    uVar1 = uVar2 + 1;
  } while (uVar5 < 0x10000000);
  if (uVar2 + 1 < 0x200) {
    return uVar2 + 0x201 >> 1;
  }
  __assert_fail("256 <= estimate && estimate < 512",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                ,0x36b,"int do_recip_sqrt_estimate(int)");
}

Assistant:

static int do_recip_sqrt_estimate(int a)
{
    int b, estimate;

    assert(128 <= a && a < 512);
    if (a < 256) {
        a = a * 2 + 1;
    } else {
        a = (a >> 1) << 1;
        a = (a + 1) * 2;
    }
    b = 512;
    while (a * (b + 1) * (b + 1) < (1 << 28)) {
        b += 1;
    }
    estimate = (b + 1) / 2;
    assert(256 <= estimate && estimate < 512);

    return estimate;
}